

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

int sptk::snack::xget_window
              (float *dout,int n,int type,int *n0p,float **dinp,int *wsizep,float **windp)

{
  int iVar1;
  int *piVar2;
  int *in_RCX;
  int in_ESI;
  float *in_R8;
  float *in_R9;
  int i;
  float *p;
  float preemp;
  int n0;
  float *din;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffb8;
  
  piVar2 = *(int **)in_R8;
  iVar1 = *in_RCX;
  if (*in_RCX < in_ESI) {
    if (piVar2 != (int *)0x0) {
      ckfree((void *)0x13c456);
    }
    piVar2 = (int *)ckalloc(0x13c46d);
    if (piVar2 == (int *)0x0) {
      fprintf(_stderr,"Allocation problems in xget_window()\n");
      return 0;
    }
    iVar1 = 0;
    in_stack_ffffffffffffffb8 = piVar2;
    while (in_stack_ffffffffffffffb4 = iVar1 + 1, iVar1 < in_ESI) {
      *in_stack_ffffffffffffffb8 = 0x3f800000;
      iVar1 = in_stack_ffffffffffffffb4;
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1;
    }
    *(int **)in_R8 = piVar2;
    *in_RCX = in_ESI;
    iVar1 = in_ESI;
  }
  iVar1 = window(in_R8,in_R9,(int)((ulong)piVar2 >> 0x20),SUB84(piVar2,0),iVar1,
                 in_stack_ffffffffffffffb8,
                 (float **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return iVar1;
}

Assistant:

int xget_window(float *dout, int n, int type, int *n0p, float **dinp,
                int *wsizep, float **windp)
#endif
{
#if 0
  static float *din = NULL;
  static int n0 = 0;
#else
  float *din = *dinp;
  int n0 = *n0p;
#endif
  float preemp = 0.0;

  if(n > n0) {
    register float *p;
    register int i;
    
    if(din) ckfree((void *)din);
    din = NULL;
    if(!(din = (float*)ckalloc(sizeof(float)*n))) {
      Fprintf(stderr,"Allocation problems in xget_window()\n");
      return(FALSE);
    }
    for(i=0, p=din; i++ < n; ) *p++ = 1;
    n0 = n;
#if 1
    *dinp = din;
    *n0p = n0;
#endif
  }
#if 0
  return(window(din, dout, n, preemp, type));
#else
  return(window(din, dout, n, preemp, type, wsizep, windp));
#endif
}